

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  TcpClient *pTVar1;
  undefined8 uVar2;
  pointer puVar3;
  int iVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 uVar6;
  long lVar7;
  int concurrency;
  atomic_int active_clients;
  int msg_num;
  atomic_int finished_clients;
  atomic_int connected_clients;
  shared_ptr<Liby::TcpClient> echo_client;
  unsigned_long bytesPerClients;
  vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> conns;
  Timestamp start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytes;
  vector<char,_std::allocator<char>_> buf;
  EventLoopGroup group;
  int local_1cc;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  int local_19c;
  int local_198;
  allocator local_192;
  allocator local_191;
  undefined4 local_190;
  undefined4 local_18c;
  TcpClient *local_188;
  _Any_data local_180;
  Timestamp local_170;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  pointer psStack_140;
  pointer local_138;
  timeval local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<char,_std::allocator<char>_> local_100;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  EventLoopGroup local_c0;
  
  local_18c = 0;
  local_190 = 0;
  local_180._8_8_ = argv;
  if (argc == 6) {
    local_198 = atoi(argv[4]);
    iVar4 = atoi(argv[5]);
    local_19c = atoi(argv[3]);
    local_1cc = local_19c;
  }
  else {
    if (argc != 7) {
      print_usage();
      return 1;
    }
    local_198 = atoi(argv[5]);
    iVar4 = atoi(argv[6]);
    local_1cc = atoi(argv[3]);
    local_19c = atoi(argv[4]);
  }
  LOCK();
  UNLOCK();
  local_150._0_8_ = (long)local_198 * (long)iVar4;
  local_c0.n_._0_1_ = 0x41;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_100,(long)iVar4,(value_type *)&local_c0,(allocator_type *)local_1c8._M_pod_data)
  ;
  local_c0.n_ = 0;
  local_c0._4_4_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_118,(long)local_1cc,(value_type_conflict1 *)&local_c0,
             (allocator_type *)local_1c8._M_pod_data);
  local_150._8_8_ = (void *)0x0;
  psStack_140 = (pointer)0x0;
  local_138 = (pointer)0x0;
  local_1c8._M_unused._M_object = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"EPOLL","");
  Liby::EventLoopGroup::EventLoopGroup(&local_c0,4,(string *)&local_1c8);
  uVar6 = local_180._8_8_;
  if ((code **)local_1c8._M_unused._0_8_ != &local_1b8) {
    operator_delete(local_1c8._M_unused._M_object);
  }
  local_128.tv_sec = 0;
  local_128.tv_usec = 0;
  gettimeofday(&local_128,(__timezone_ptr_t)0x0);
  if (0 < local_1cc) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      std::__cxx11::string::string((string *)local_1c8._M_pod_data,*(char **)(uVar6 + 8),&local_191)
      ;
      std::__cxx11::string::string((string *)&local_170,*(char **)(uVar6 + 0x10),&local_192);
      Liby::EventLoopGroup::creatTcpClient
                ((EventLoopGroup *)&local_188,(string *)&local_c0,(string *)&local_1c8);
      if ((undefined1 *)local_170.tv_.tv_sec != local_160) {
        operator_delete((void *)local_170.tv_.tv_sec);
      }
      if ((code **)local_1c8._M_unused._0_8_ != &local_1b8) {
        operator_delete(local_1c8._M_unused._M_object);
      }
      uVar2 = local_180._M_unused._0_8_;
      pTVar1 = local_188;
      if (lVar5 < local_19c) {
        local_170.tv_.tv_sec = 8;
        local_170.tv_.tv_usec = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_unused._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_180._M_unused._M_function_pointer + 8) =
                 *(int *)(local_180._M_unused._M_function_pointer + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_180._M_unused._M_function_pointer + 8) =
                 *(int *)(local_180._M_unused._M_function_pointer + 8) + 1;
          }
        }
        local_1b8 = (code *)0x0;
        pcStack_1b0 = (code *)0x0;
        local_1c8._M_unused._M_object = (void *)0x0;
        local_1c8._8_8_ = 0;
        local_1c8._M_unused._M_object = operator_new(0x10);
        *(TcpClient **)local_1c8._M_unused._0_8_ = pTVar1;
        *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 8) = uVar2;
        pcStack_1b0 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:42:52)>
                      ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:42:52)>
                    ::_M_manager;
        Liby::TimerMixin::runAfter(&pTVar1->super_TimerMixin,&local_170,(BasicHandler *)&local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,3);
        }
        puVar3 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = local_150._0_8_;
        pTVar1 = local_188;
        local_1c8._M_unused._M_object = (void *)0x0;
        local_1c8._8_8_ = 0;
        local_1b8 = (code *)0x0;
        pcStack_1b0 = (code *)0x0;
        local_1c8._M_unused._M_object = operator_new(0x48);
        *(vector<char,_std::allocator<char>_> **)local_1c8._M_unused._0_8_ = &local_100;
        *(code **)((long)local_1c8._M_unused._0_8_ + 8) = (code *)((long)puVar3 + lVar7);
        *(timeval **)((long)local_1c8._M_unused._0_8_ + 0x10) = &local_128;
        *(int **)((long)local_1c8._M_unused._0_8_ + 0x18) = &local_19c;
        *(undefined1 **)((long)local_1c8._M_unused._0_8_ + 0x20) = local_150 + 8;
        *(undefined4 **)((long)local_1c8._M_unused._0_8_ + 0x28) = &local_190;
        *(undefined4 **)((long)local_1c8._M_unused._0_8_ + 0x30) = &local_18c;
        *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 0x38) = uVar6;
        *(EventLoopGroup **)((long)local_1c8._M_unused._0_8_ + 0x40) = &local_c0;
        pcStack_1b0 = std::
                      _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:44:36)>
                      ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:44:36)>
                    ::_M_manager;
        Liby::TcpClient::onConnect(pTVar1,(Connector *)&local_1c8);
        uVar6 = local_180._8_8_;
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,3);
        }
      }
      else {
        local_170.tv_.tv_sec = 1000;
        local_170.tv_.tv_usec = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_unused._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_180._M_unused._M_function_pointer + 8) =
                 *(int *)(local_180._M_unused._M_function_pointer + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_180._M_unused._M_function_pointer + 8) =
                 *(int *)(local_180._M_unused._M_function_pointer + 8) + 1;
          }
        }
        local_1b8 = (code *)0x0;
        pcStack_1b0 = (code *)0x0;
        local_1c8._M_unused._M_object = (void *)0x0;
        local_1c8._8_8_ = 0;
        local_1c8._M_unused._M_object = operator_new(0x10);
        *(TcpClient **)local_1c8._M_unused._0_8_ = pTVar1;
        *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 8) = uVar2;
        pcStack_1b0 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:99:55)>
                      ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:99:55)>
                    ::_M_manager;
        Liby::TimerMixin::runEvery(&pTVar1->super_TimerMixin,&local_170,(BasicHandler *)&local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,3);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_unused._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_unused._0_8_);
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 < local_1cc);
  }
  local_1b8 = (code *)0x0;
  pcStack_1b0 = (code *)0x0;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._M_unused._M_object = operator_new(0x28);
  *(undefined1 **)local_1c8._M_unused._0_8_ = local_150;
  *(undefined4 **)((long)local_1c8._M_unused._0_8_ + 8) = &local_190;
  *(timeval **)((long)local_1c8._M_unused._0_8_ + 0x10) = &local_128;
  *(int **)((long)local_1c8._M_unused._0_8_ + 0x18) = &local_1cc;
  *(int **)((long)local_1c8._M_unused._0_8_ + 0x20) = &local_198;
  pcStack_1b0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:103:22)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:103:22)>
              ::_M_manager;
  Liby::ExitCaller::call((function<void_()> *)&local_1c8);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,3);
  }
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = &local_19c;
  pcStack_d0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:113:15)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:113:15)>
             ::_M_manager;
  Liby::EventLoopGroup::run(&local_c0,(BoolFunctor *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  Liby::EventLoopGroup::~EventLoopGroup(&local_c0);
  if ((void *)local_150._8_8_ != (void *)0x0) {
    operator_delete((void *)local_150._8_8_);
  }
  if ((pointer)local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    //    Logger::setLevel(Logger::LogLevel::VERBOSE);
    int msg_num, msg_len, concurrency;
    atomic_int active_clients;
    atomic_int connected_clients(0);
    atomic_int finished_clients(0);
    if (argc == 7) {
        msg_num = ::atoi(argv[5]);
        msg_len = ::atoi(argv[6]);
        concurrency = ::atoi(argv[3]);
        active_clients = ::atoi(argv[4]);
    } else if (argc == 6) {
        msg_num = ::atoi(argv[4]);
        msg_len = ::atoi(argv[5]);
        active_clients = concurrency = ::atoi(argv[3]);
    } else {
        print_usage();
        return 1;
    }
    unsigned long bytesPerClients = msg_len * msg_num;

    vector<char> buf(msg_len, 'A');
    vector<unsigned long> bytes(concurrency, 0);
    vector<Connection *> conns;

    EventLoopGroup group(4, "EPOLL");
    auto start = Timestamp::now();
    for (int i = 0; i < concurrency; i++) {
        auto echo_client = group.creatTcpClient(argv[1], argv[2]);
        if (i < active_clients) {
            echo_client->runAfter(Timestamp(8, 0), [echo_client] {});
            unsigned long *pBytes = &bytes[i];
            echo_client->onConnect([&buf, pBytes, &start, &active_clients,
                                    &conns, &finished_clients,
                                    &connected_clients, bytesPerClients,
                                    &group](std::shared_ptr<Connection> conn) {
                if (!conn) {
                    return;
                }

                connected_clients++;
                conns.push_back(conn.get());
                if (connected_clients != active_clients) {
                    static int i = 0;
                    i++;
                    //                    info("%d", i);
                    conn->enableRead(false);
                } else {
                    start = Timestamp::now();
                    for (auto c : conns) {
                        c->runEventHandler([c, &buf] {
                            c->enableRead(true);
                            c->send(&buf[0], buf.size());
                        });
                    }
                }

                conn->onRead([&buf, pBytes, bytesPerClients, &active_clients,
                              &finished_clients, &group](Connection &c) {
                    *pBytes += c.read().size();
                    c.send(c.read());

                    info("herohahaha in loop %p",
                         EventLoop::curr_thread_loop());

                    if (*pBytes >= bytesPerClients) {
                        c.destroy();
                        group.robinLoop1(0)->runEventHandler(
                            [&active_clients, &finished_clients] {
                                finished_clients++;
                                if (--active_clients <= 0) {
                                    ::exit(0);
                                }
                            });
                    }
                });
                conn->onErro([&group, &active_clients](Connection &) {
                    group.robinLoop1(0)->runEventHandler([&active_clients] {
                        if (--active_clients <= 0) {
                            ::exit(0);
                        }
                    });
                });

                //                conn->send(&buf[0], buf.size());
            });
        } else {
            echo_client->runEvery(Timestamp(1000, 0), [echo_client] {});
        }
    }

    ExitCaller::call([&] {
        auto end = Timestamp::now();
        unsigned long totalBytes = bytesPerClients * finished_clients;
        info("总时间 %g 秒", (end - start).toSecF());
        info("totalBytes = %ld", totalBytes);
        info("速度 %lf MiB/s",
             totalBytes / (end - start).toSecF() / 1024 / 1024);
        info(" QPS %d", (int)(concurrency * msg_num / (end - start).toSecF()));
    });

    group.run([&active_clients] { return active_clients > 0; });

    return 0;
}